

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
          (Iterator<TestType,_true,_std::allocator<unsigned_long>_> *this)

{
  ulong uVar1;
  reference pTVar2;
  View<TestType,_true,_std::allocator<unsigned_long>_> *this_00;
  value_type vVar3;
  view_pointer this_01;
  bool bVar4;
  size_type sVar5;
  size_t sVar6;
  size_t sVar7;
  reference pTVar8;
  CoordinateOrder *pCVar9;
  const_reference pvVar10;
  pointer __n;
  iterator outit;
  reference pvVar11;
  bool local_72;
  bool local_71;
  ulong local_68;
  size_t j_2;
  allocator<unsigned_long> local_41;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> testCoord;
  size_t j_1;
  size_t d;
  size_t j;
  Iterator<TestType,_true,_std::allocator<unsigned_long>_> *this_local;
  
  if (this->view_ == (view_pointer)0x0) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->coordinates_);
    local_71 = false;
    if ((sVar5 == 0) && (local_71 = false, this->index_ == 0)) {
      local_71 = this->pointer_ == (pointer)0x0;
    }
    marray_detail::Assert<bool>(local_71);
  }
  else {
    sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::size(this->view_);
    if (sVar6 == 0) {
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->coordinates_);
      local_72 = false;
      if ((sVar5 == 0) && (local_72 = false, this->index_ == 0)) {
        local_72 = this->pointer_ == (pointer)0x0;
      }
      marray_detail::Assert<bool>(local_72);
    }
    else {
      uVar1 = this->index_;
      sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::size(this->view_);
      marray_detail::Assert<bool>(uVar1 <= sVar6);
      sVar6 = this->index_;
      sVar7 = View<TestType,_true,_std::allocator<unsigned_long>_>::size(this->view_);
      if (sVar6 == sVar7) {
        pTVar2 = this->pointer_;
        this_00 = this->view_;
        sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::size(this->view_);
        pTVar8 = View<TestType,_true,_std::allocator<unsigned_long>_>::operator()(this_00,sVar6 - 1)
        ;
        marray_detail::Assert<bool>(pTVar2 == pTVar8 + 1);
      }
      else {
        pTVar2 = this->pointer_;
        pTVar8 = View<TestType,_true,_std::allocator<unsigned_long>_>::operator()
                           (this->view_,this->index_);
        marray_detail::Assert<bool>(pTVar2 == pTVar8);
      }
      bVar4 = View<TestType,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
      if (!bVar4) {
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          (&this->coordinates_);
        sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
        marray_detail::Assert<bool>(sVar5 == sVar6);
        sVar6 = this->index_;
        sVar7 = View<TestType,_true,_std::allocator<unsigned_long>_>::size(this->view_);
        if (sVar6 == sVar7) {
          pCVar9 = View<TestType,_true,_std::allocator<unsigned_long>_>::coordinateOrder
                             (this->view_);
          if (*pCVar9 == LastMajorOrder) {
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->coordinates_,0);
            vVar3 = *pvVar10;
            sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::shape(this->view_,0);
            marray_detail::Assert<bool>(vVar3 == sVar6);
            for (d = 1; sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                          (&this->coordinates_), d < sVar5; d = d + 1) {
              pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&this->coordinates_,d);
              vVar3 = *pvVar10;
              sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::shape(this->view_,d);
              marray_detail::Assert<bool>(vVar3 == sVar6 - 1);
            }
          }
          else {
            sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
            __n = (pointer)(sVar6 - 1);
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->coordinates_,(size_type)__n);
            vVar3 = *pvVar10;
            sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::shape
                              (this->view_,(size_t)__n);
            marray_detail::Assert<bool>(vVar3 == sVar6);
            for (testCoord.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                testCoord.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < __n;
                testCoord.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)((long)testCoord.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
              pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&this->coordinates_,
                                   (size_type)
                                   testCoord.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              vVar3 = *pvVar10;
              sVar6 = View<TestType,_true,_std::allocator<unsigned_long>_>::shape
                                (this->view_,
                                 (size_t)testCoord.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              marray_detail::Assert<bool>(vVar3 == sVar6 - 1);
            }
          }
        }
        else {
          sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            (&this->coordinates_);
          std::allocator<unsigned_long>::allocator(&local_41);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,sVar5,
                     &local_41);
          std::allocator<unsigned_long>::~allocator(&local_41);
          this_01 = this->view_;
          sVar6 = this->index_;
          outit = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
          View<TestType,true,std::allocator<unsigned_long>>::
          indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((View<TestType,true,std::allocator<unsigned_long>> *)this_01,sVar6,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )outit._M_current);
          for (local_68 = 0;
              sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                (&this->coordinates_), local_68 < sVar5; local_68 = local_68 + 1) {
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->coordinates_,local_68);
            vVar3 = *pvVar10;
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                                 local_68);
            marray_detail::Assert<bool>(vVar3 == *pvVar11);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
        }
      }
    }
  }
  return;
}

Assistant:

inline void 
Iterator<T, isConst, A>::testInvariant() const
{
    if(!MARRAY_NO_DEBUG) {
        if(view_ == 0) { 
            marray_detail::Assert(coordinates_.size() == 0 
                && index_ == 0
                && pointer_ == 0);
        }
        else { 
            if(view_->size() == 0) { // un-initialized view
                marray_detail::Assert(coordinates_.size() == 0 
                    && index_ == 0
                    && pointer_ == 0);
            }
            else { // initialized view
                marray_detail::Assert(index_ >= 0 && index_ <= view_->size());
                if(index_ == view_->size()) { // end iterator
                    marray_detail::Assert(pointer_ == &((*view_)(view_->size()-1)) + 1);
                }
                else {
                    marray_detail::Assert(pointer_ == &((*view_)(index_)));
                }
                if(!view_->isSimple()) {
                    marray_detail::Assert(coordinates_.size() == view_->dimension());
                    if(index_ == view_->size()) { // end iterator
                        if(view_->coordinateOrder() == LastMajorOrder) {
                            marray_detail::Assert(coordinates_[0] == view_->shape(0));
                            for(std::size_t j=1; j<coordinates_.size(); ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                        else { // FirstMajorOrder
                            std::size_t d = view_->dimension() - 1;
                            marray_detail::Assert(coordinates_[d] == view_->shape(d));
                            for(std::size_t j=0; j<d; ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                    }
                    else {
                        std::vector<std::size_t> testCoord(coordinates_.size());
                        view_->indexToCoordinates(index_, testCoord.begin());
                        for(std::size_t j=0; j<coordinates_.size(); ++j) {
                            marray_detail::Assert(coordinates_[j] == testCoord[j]);
                        }
                    }
                }
            }
        }
    }
}